

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15PrivateFunctionMapFactory.cpp
# Opt level: O2

ElementFunctionMap *
COLLADASaxFWL15::FunctionMapFactory::createFunctionMap__library_geometries__allChildren(void)

{
  int iVar1;
  mapped_type *pmVar2;
  
  if (createFunctionMap__library_geometries__allChildren()::functionMap == '\0') {
    iVar1 = __cxa_guard_acquire(&createFunctionMap__library_geometries__allChildren()::functionMap);
    if (iVar1 != 0) {
      createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_color = _S_red;
      createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_left =
           &createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_header._M_right =
           &createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
            super__Rb_tree_header._M_header;
      createFunctionMap__library_geometries__allChildren::functionMap._M_t._M_impl.
      super__Rb_tree_header._M_node_count = 0;
      __cxa_atexit(std::
                   map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
                   ::~map,&createFunctionMap__library_geometries__allChildren::functionMap,
                   &__dso_handle);
      __cxa_guard_release(&createFunctionMap__library_geometries__allChildren()::functionMap);
    }
  }
  if (createFunctionMap__library_geometries__allChildren()::mapFilled == '\0') {
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_COLLADA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__COLLADA;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__COLLADA;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__COLLADA;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__COLLADA;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__COLLADA;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LIBRARY_GEOMETRIES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__library_geometries;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__library_geometries;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__library_geometries;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__library_geometries;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__library_geometries;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__library_geometries;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_GEOMETRY);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__geometry
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__geometry;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__geometry;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__geometry;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__geometry;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__geometry;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CONTRIBUTOR);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__contributor;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__contributor;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__contributor;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__contributor;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__contributor;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__contributor;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_COVERAGE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__coverage
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__coverage;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__coverage;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__coverage;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__coverage;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__coverage;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CREATED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__created;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__created;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__created;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__created;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__created;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__created;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_EMAIL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_email;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_email;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_email;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_email;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_email;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_email;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHOR_WEBSITE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__author_website;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__author_website;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__author_website
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__author_website;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__author_website;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__author_website;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_AUTHORING_TOOL);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__authoring_tool
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__authoring_tool;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_COMMENTS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__comments
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__comments;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__comments;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__comments;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__comments;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__comments;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_COPYRIGHT);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__copyright;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__copyright;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__copyright;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__copyright;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__copyright;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__copyright;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_DATA);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source_data;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source_data;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source_data;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source_data;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source_data;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source_data;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_GEOGRAPHIC_LOCATION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__geographic_location;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__geographic_location;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__geographic_location;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__geographic_location;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__geographic_location;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__geographic_location;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ALTITUDE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__altitude
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__altitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__altitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__altitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__altitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__altitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LATITUDE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__latitude
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__latitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__latitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__latitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__latitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__latitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LONGITUDE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__longitude;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__longitude;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__longitude;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__longitude;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__longitude;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__longitude;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_KEYWORDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__keywords
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__keywords;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__keywords;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__keywords;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__keywords;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__keywords;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_MODIFIED);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__modified
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__modified;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__modified;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__modified;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__modified;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__modified;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_REVISION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__revision
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__revision;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__revision;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__revision;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__revision;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__revision;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SUBJECT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__subject;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__subject;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__subject;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__subject;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__subject;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__subject;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TITLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__title;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__title;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__title;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__title;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__title;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__title;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_UNIT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__unit;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__unit;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__unit;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__unit;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__unit;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__unit;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_UP_AXIS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__up_axis;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__up_axis;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__up_axis;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__up_axis;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__up_axis;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__up_axis;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_BREP);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__brep;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__brep;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__brep;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__brep;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__brep;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__brep;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CONVEX_MESH);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__convex_mesh;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_MESH);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__mesh;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__mesh;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__mesh;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__mesh;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__mesh;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__mesh;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SPLINE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__spline;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__spline;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__spline;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__spline;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__spline;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__spline;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CURVES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__curves;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__curves;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__curves;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__curves;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__curves;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__curves;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EDGES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__edges;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__edges;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__edges;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__edges;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__edges;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__edges;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_FACES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__faces;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__faces;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__faces;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__faces;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__faces;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__faces;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_PCURVES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__pcurves;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__pcurves;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__pcurves;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__pcurves;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__pcurves;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__pcurves;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SHELLS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__shells;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__shells;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__shells;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__shells;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__shells;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__shells;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOLIDS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__solids;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__solids;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__solids;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__solids;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__solids;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__solids;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SURFACE_CURVES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__surface_curves;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__surface_curves;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__surface_curves
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__surface_curves;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__surface_curves;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__surface_curves;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SURFACES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__surfaces
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__surfaces;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__surfaces;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__surfaces;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__surfaces;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__surfaces;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VERTICES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vertices
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vertices;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_WIRES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__wires;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__wires;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__wires;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__wires;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__wires;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__wires;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CURVE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__curve;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__curve;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__curve;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__curve;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__curve;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__curve;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CIRCLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__circle;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__circle;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__circle;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__circle;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__circle;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__circle;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ELLIPSE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__ellipse;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__ellipse;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__ellipse;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__ellipse;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__ellipse;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__ellipse;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_HYPERBOLA);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__hyperbola;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__hyperbola;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__hyperbola;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__hyperbola;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__hyperbola;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__hyperbola;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LINE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__line;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__line;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__line;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__line;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__line;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__line;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_NURBS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__nurbs;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__nurbs;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__nurbs;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__nurbs;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__nurbs;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__nurbs;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIENT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__orient;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__orient;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__orient;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__orient;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__orient;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__orient;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIGIN____ORIGIN_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_PARABOLA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__parabola
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__parabola;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__parabola;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__parabola;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__parabola;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__parabola;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__radius____float_type
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT2_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT2_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_DIRECTION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__direction;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__direction;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__direction;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__direction;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__direction;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__direction;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIGIN____FLOAT3_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_NURBS_TYPE____CONTROL_VERTICES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__nurbs_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_IDREF_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__IDREF_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_NAME_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__Name_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__Name_array
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__Name_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__Name_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__Name_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__Name_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SIDREF_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__SIDREF_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ASSET);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__asset;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__asset;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__asset;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__asset;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__asset;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__asset;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_BOOL_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__bool_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__bool_array
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__bool_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__bool_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__bool_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__bool_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_FLOAT_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__float_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__float_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__float_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__float_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__float_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__float_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INT_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__int_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__int_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__int_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__int_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__int_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__int_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__technique____technique_type
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE_TYPE____TECHNIQUE_COMMON);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source_type____technique_common
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__source_type____technique_common;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TOKEN_ARRAY);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__token_array;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__token_array;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__token_array;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__token_array;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__token_array;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__token_array;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ACCESSOR);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__accessor
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__accessor;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__accessor;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__accessor;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__accessor;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__accessor;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_PARAM____PARAM_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__param____param_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__param____param_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__param____param_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__param____param_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__param____param_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__param____param_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_FOCAL);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__focal;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__focal;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__focal;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__focal;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__focal;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__focal;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CURVE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__curve;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__curve;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__curve;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__curve;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__curve;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__curve;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SURFACE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__surface;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__surface;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__surface;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__surface;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__surface;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__surface;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CONE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__cone;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__cone;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__cone;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__cone;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__cone;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__cone;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SURFACE_TYPE____CYLINDER);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__surface_type____cylinder;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_NURBS_SURFACE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__nurbs_surface;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIENT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__orient;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__orient;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__orient;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__orient;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__orient;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__orient;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIGIN____ORIGIN_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__origin____origin_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_PLANE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__plane;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__plane;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__plane;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__plane;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__plane;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__plane;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SPHERE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__sphere;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__sphere;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__sphere;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__sphere;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__sphere;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__sphere;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SWEPT_SURFACE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__swept_surface;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__swept_surface;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__swept_surface;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__swept_surface;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__swept_surface;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__swept_surface;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TORUS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__torus;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__torus;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__torus;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__torus;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__torus;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__torus;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ANGLE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__angle;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__angle;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__angle;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__angle;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__angle;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__angle;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__radius____float_type
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__radius____float_type
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_NURBS_SURFACE_TYPE____CONTROL_VERTICES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)
         ColladaParserAutoGen15Private::_data__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__nurbs_surface_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EQUATION);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__equation
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__equation;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__equation;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__equation;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__equation;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__equation;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__radius____float_type
    ;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_AXIS____FLOAT3_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__axis____float3_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_CURVE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__curve;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__curve;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__curve;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__curve;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__curve;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__curve;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_DIRECTION);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__direction;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__direction;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__direction;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__direction;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__direction;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__direction;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_ORIGIN____FLOAT3_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__origin____float3_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_RADIUS____FLOAT2_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LINES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__lines;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__lines;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__lines;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__lines;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__lines;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__lines;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LINESTRIPS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__linestrips;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__linestrips
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__linestrips;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__linestrips;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__linestrips;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__linestrips;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_POLYGONS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__polygons
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__polygons;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__polygons;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__polygons;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__polygons;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__polygons;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_POLYLIST);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__polylist
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__polylist;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__polylist;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__polylist;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__polylist;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__polylist;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRIANGLES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__triangles;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__triangles;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__triangles;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__triangles;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__triangles;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__triangles;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRIFANS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__trifans;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__trifans;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__trifans;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__trifans;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__trifans;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__trifans;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRISTRIPS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__tristrips;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__tristrips;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__tristrips;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__tristrips;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__tristrips;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__tristrips;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VERTICES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vertices
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vertices;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_PH);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__ph;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__ph;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__ph;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__ph;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__ph;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__ph;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_H);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__h;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__h;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__h;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__h;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__h;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__h;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VCOUNT);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vcount;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vcount;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vcount;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vcount;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vcount;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vcount;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_offset_type
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)
         ColladaParserAutoGen15Private::_end__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_P);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__p;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__p;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__p;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__p;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__p;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__p;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LINES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__lines;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__lines;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__lines;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__lines;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__lines;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__lines;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_LINESTRIPS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__linestrips;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__linestrips
    ;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__linestrips;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__linestrips;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__linestrips;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__linestrips;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_POLYGONS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__polygons
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__polygons;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__polygons;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__polygons;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__polygons;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__polygons;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_POLYLIST);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__polylist
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__polylist;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__polylist;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__polylist;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__polylist;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__polylist;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRIANGLES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__triangles;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__triangles;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__triangles;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__triangles;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__triangles;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__triangles;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRIFANS);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__trifans;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__trifans;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__trifans;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__trifans;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__trifans;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__trifans;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_TRISTRIPS);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__tristrips;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__tristrips;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__tristrips;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__tristrips;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__tristrips;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__tristrips;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_VERTICES);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__vertices
    ;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__vertices;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SPLINE_TYPE____CONTROL_VERTICES);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)
         ColladaParserAutoGen15Private::_begin__spline_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__spline_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__spline_type____control_vertices
    ;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__spline_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__spline_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__spline_type____control_vertices;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_SOURCE);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__source;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__source;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__source;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__source;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__source;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__source;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_EXTRA);
    pmVar2->beginFunction = (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__extra;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction = (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__extra;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction = (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__extra;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)ColladaParserAutoGen15Private::_preBegin__extra;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)ColladaParserAutoGen15Private::_preEnd__extra;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)ColladaParserAutoGen15Private::_freeAttributes__extra;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    pmVar2 = std::
             map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>::FunctionStruct>_>_>
             ::operator[](&createFunctionMap__library_geometries__allChildren::functionMap,
                          &HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE);
    pmVar2->beginFunction =
         (ElementBeginFunctionPtr)ColladaParserAutoGen15Private::_begin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x8 = 0;
    pmVar2->textDataFunction =
         (TextDataFunctionPtr)ColladaParserAutoGen15Private::_data__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x18 = 0;
    pmVar2->endFunction =
         (ElementEndFunctionPtr)ColladaParserAutoGen15Private::_end__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x28 = 0;
    pmVar2->validateBeginFunction =
         (ElementValidateBeginFunctionPtr)
         ColladaParserAutoGen15Private::_preBegin__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x38 = 0;
    pmVar2->validateEndFunction =
         (ElementValidateEndFunctionPtr)
         ColladaParserAutoGen15Private::_preEnd__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x48 = 0;
    pmVar2->freeAttributesFunction =
         (FreeAttributesFunctionPtr)
         ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type;
    *(undefined8 *)&pmVar2->field_0x58 = 0;
    createFunctionMap__library_geometries__allChildren()::mapFilled = '\x01';
  }
  return &createFunctionMap__library_geometries__allChildren::functionMap;
}

Assistant:

const ColladaParserAutoGen15Private::ElementFunctionMap& FunctionMapFactory::createFunctionMap__library_geometries__allChildren() {
static ColladaParserAutoGen15Private::ElementFunctionMap functionMap;
static bool mapFilled = false;
if ( !mapFilled )
{
functionMap[HASH_ELEMENT_COLLADA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__COLLADA, &ColladaParserAutoGen15Private::_data__COLLADA, &ColladaParserAutoGen15Private::_end__COLLADA, &ColladaParserAutoGen15Private::_preBegin__COLLADA, &ColladaParserAutoGen15Private::_preEnd__COLLADA, &ColladaParserAutoGen15Private::_freeAttributes__COLLADA);
functionMap[HASH_ELEMENT_LIBRARY_GEOMETRIES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__library_geometries, &ColladaParserAutoGen15Private::_data__library_geometries, &ColladaParserAutoGen15Private::_end__library_geometries, &ColladaParserAutoGen15Private::_preBegin__library_geometries, &ColladaParserAutoGen15Private::_preEnd__library_geometries, &ColladaParserAutoGen15Private::_freeAttributes__library_geometries);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_GEOMETRY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__geometry, &ColladaParserAutoGen15Private::_data__geometry, &ColladaParserAutoGen15Private::_end__geometry, &ColladaParserAutoGen15Private::_preBegin__geometry, &ColladaParserAutoGen15Private::_preEnd__geometry, &ColladaParserAutoGen15Private::_freeAttributes__geometry);
functionMap[HASH_ELEMENT_CONTRIBUTOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__contributor, &ColladaParserAutoGen15Private::_data__contributor, &ColladaParserAutoGen15Private::_end__contributor, &ColladaParserAutoGen15Private::_preBegin__contributor, &ColladaParserAutoGen15Private::_preEnd__contributor, &ColladaParserAutoGen15Private::_freeAttributes__contributor);
functionMap[HASH_ELEMENT_COVERAGE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__coverage, &ColladaParserAutoGen15Private::_data__coverage, &ColladaParserAutoGen15Private::_end__coverage, &ColladaParserAutoGen15Private::_preBegin__coverage, &ColladaParserAutoGen15Private::_preEnd__coverage, &ColladaParserAutoGen15Private::_freeAttributes__coverage);
functionMap[HASH_ELEMENT_CREATED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__created, &ColladaParserAutoGen15Private::_data__created, &ColladaParserAutoGen15Private::_end__created, &ColladaParserAutoGen15Private::_preBegin__created, &ColladaParserAutoGen15Private::_preEnd__created, &ColladaParserAutoGen15Private::_freeAttributes__created);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_AUTHOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author, &ColladaParserAutoGen15Private::_data__author, &ColladaParserAutoGen15Private::_end__author, &ColladaParserAutoGen15Private::_preBegin__author, &ColladaParserAutoGen15Private::_preEnd__author, &ColladaParserAutoGen15Private::_freeAttributes__author);
functionMap[HASH_ELEMENT_AUTHOR_EMAIL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_email, &ColladaParserAutoGen15Private::_data__author_email, &ColladaParserAutoGen15Private::_end__author_email, &ColladaParserAutoGen15Private::_preBegin__author_email, &ColladaParserAutoGen15Private::_preEnd__author_email, &ColladaParserAutoGen15Private::_freeAttributes__author_email);
functionMap[HASH_ELEMENT_AUTHOR_WEBSITE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__author_website, &ColladaParserAutoGen15Private::_data__author_website, &ColladaParserAutoGen15Private::_end__author_website, &ColladaParserAutoGen15Private::_preBegin__author_website, &ColladaParserAutoGen15Private::_preEnd__author_website, &ColladaParserAutoGen15Private::_freeAttributes__author_website);
functionMap[HASH_ELEMENT_AUTHORING_TOOL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__authoring_tool, &ColladaParserAutoGen15Private::_data__authoring_tool, &ColladaParserAutoGen15Private::_end__authoring_tool, &ColladaParserAutoGen15Private::_preBegin__authoring_tool, &ColladaParserAutoGen15Private::_preEnd__authoring_tool, &ColladaParserAutoGen15Private::_freeAttributes__authoring_tool);
functionMap[HASH_ELEMENT_COMMENTS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__comments, &ColladaParserAutoGen15Private::_data__comments, &ColladaParserAutoGen15Private::_end__comments, &ColladaParserAutoGen15Private::_preBegin__comments, &ColladaParserAutoGen15Private::_preEnd__comments, &ColladaParserAutoGen15Private::_freeAttributes__comments);
functionMap[HASH_ELEMENT_COPYRIGHT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__copyright, &ColladaParserAutoGen15Private::_data__copyright, &ColladaParserAutoGen15Private::_end__copyright, &ColladaParserAutoGen15Private::_preBegin__copyright, &ColladaParserAutoGen15Private::_preEnd__copyright, &ColladaParserAutoGen15Private::_freeAttributes__copyright);
functionMap[HASH_ELEMENT_SOURCE_DATA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_data, &ColladaParserAutoGen15Private::_data__source_data, &ColladaParserAutoGen15Private::_end__source_data, &ColladaParserAutoGen15Private::_preBegin__source_data, &ColladaParserAutoGen15Private::_preEnd__source_data, &ColladaParserAutoGen15Private::_freeAttributes__source_data);
functionMap[HASH_ELEMENT_GEOGRAPHIC_LOCATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__geographic_location, &ColladaParserAutoGen15Private::_data__geographic_location, &ColladaParserAutoGen15Private::_end__geographic_location, &ColladaParserAutoGen15Private::_preBegin__geographic_location, &ColladaParserAutoGen15Private::_preEnd__geographic_location, &ColladaParserAutoGen15Private::_freeAttributes__geographic_location);
functionMap[HASH_ELEMENT_ALTITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__altitude, &ColladaParserAutoGen15Private::_data__altitude, &ColladaParserAutoGen15Private::_end__altitude, &ColladaParserAutoGen15Private::_preBegin__altitude, &ColladaParserAutoGen15Private::_preEnd__altitude, &ColladaParserAutoGen15Private::_freeAttributes__altitude);
functionMap[HASH_ELEMENT_LATITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__latitude, &ColladaParserAutoGen15Private::_data__latitude, &ColladaParserAutoGen15Private::_end__latitude, &ColladaParserAutoGen15Private::_preBegin__latitude, &ColladaParserAutoGen15Private::_preEnd__latitude, &ColladaParserAutoGen15Private::_freeAttributes__latitude);
functionMap[HASH_ELEMENT_LONGITUDE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__longitude, &ColladaParserAutoGen15Private::_data__longitude, &ColladaParserAutoGen15Private::_end__longitude, &ColladaParserAutoGen15Private::_preBegin__longitude, &ColladaParserAutoGen15Private::_preEnd__longitude, &ColladaParserAutoGen15Private::_freeAttributes__longitude);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_KEYWORDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__keywords, &ColladaParserAutoGen15Private::_data__keywords, &ColladaParserAutoGen15Private::_end__keywords, &ColladaParserAutoGen15Private::_preBegin__keywords, &ColladaParserAutoGen15Private::_preEnd__keywords, &ColladaParserAutoGen15Private::_freeAttributes__keywords);
functionMap[HASH_ELEMENT_MODIFIED] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__modified, &ColladaParserAutoGen15Private::_data__modified, &ColladaParserAutoGen15Private::_end__modified, &ColladaParserAutoGen15Private::_preBegin__modified, &ColladaParserAutoGen15Private::_preEnd__modified, &ColladaParserAutoGen15Private::_freeAttributes__modified);
functionMap[HASH_ELEMENT_REVISION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__revision, &ColladaParserAutoGen15Private::_data__revision, &ColladaParserAutoGen15Private::_end__revision, &ColladaParserAutoGen15Private::_preBegin__revision, &ColladaParserAutoGen15Private::_preEnd__revision, &ColladaParserAutoGen15Private::_freeAttributes__revision);
functionMap[HASH_ELEMENT_SUBJECT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__subject, &ColladaParserAutoGen15Private::_data__subject, &ColladaParserAutoGen15Private::_end__subject, &ColladaParserAutoGen15Private::_preBegin__subject, &ColladaParserAutoGen15Private::_preEnd__subject, &ColladaParserAutoGen15Private::_freeAttributes__subject);
functionMap[HASH_ELEMENT_TITLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__title, &ColladaParserAutoGen15Private::_data__title, &ColladaParserAutoGen15Private::_end__title, &ColladaParserAutoGen15Private::_preBegin__title, &ColladaParserAutoGen15Private::_preEnd__title, &ColladaParserAutoGen15Private::_freeAttributes__title);
functionMap[HASH_ELEMENT_UNIT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__unit, &ColladaParserAutoGen15Private::_data__unit, &ColladaParserAutoGen15Private::_end__unit, &ColladaParserAutoGen15Private::_preBegin__unit, &ColladaParserAutoGen15Private::_preEnd__unit, &ColladaParserAutoGen15Private::_freeAttributes__unit);
functionMap[HASH_ELEMENT_UP_AXIS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__up_axis, &ColladaParserAutoGen15Private::_data__up_axis, &ColladaParserAutoGen15Private::_end__up_axis, &ColladaParserAutoGen15Private::_preBegin__up_axis, &ColladaParserAutoGen15Private::_preEnd__up_axis, &ColladaParserAutoGen15Private::_freeAttributes__up_axis);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_BREP] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__brep, &ColladaParserAutoGen15Private::_data__brep, &ColladaParserAutoGen15Private::_end__brep, &ColladaParserAutoGen15Private::_preBegin__brep, &ColladaParserAutoGen15Private::_preEnd__brep, &ColladaParserAutoGen15Private::_freeAttributes__brep);
functionMap[HASH_ELEMENT_CONVEX_MESH] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__convex_mesh, &ColladaParserAutoGen15Private::_data__convex_mesh, &ColladaParserAutoGen15Private::_end__convex_mesh, &ColladaParserAutoGen15Private::_preBegin__convex_mesh, &ColladaParserAutoGen15Private::_preEnd__convex_mesh, &ColladaParserAutoGen15Private::_freeAttributes__convex_mesh);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_MESH] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__mesh, &ColladaParserAutoGen15Private::_data__mesh, &ColladaParserAutoGen15Private::_end__mesh, &ColladaParserAutoGen15Private::_preBegin__mesh, &ColladaParserAutoGen15Private::_preEnd__mesh, &ColladaParserAutoGen15Private::_freeAttributes__mesh);
functionMap[HASH_ELEMENT_SPLINE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__spline, &ColladaParserAutoGen15Private::_data__spline, &ColladaParserAutoGen15Private::_end__spline, &ColladaParserAutoGen15Private::_preBegin__spline, &ColladaParserAutoGen15Private::_preEnd__spline, &ColladaParserAutoGen15Private::_freeAttributes__spline);
functionMap[HASH_ELEMENT_CURVES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__curves, &ColladaParserAutoGen15Private::_data__curves, &ColladaParserAutoGen15Private::_end__curves, &ColladaParserAutoGen15Private::_preBegin__curves, &ColladaParserAutoGen15Private::_preEnd__curves, &ColladaParserAutoGen15Private::_freeAttributes__curves);
functionMap[HASH_ELEMENT_EDGES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__edges, &ColladaParserAutoGen15Private::_data__edges, &ColladaParserAutoGen15Private::_end__edges, &ColladaParserAutoGen15Private::_preBegin__edges, &ColladaParserAutoGen15Private::_preEnd__edges, &ColladaParserAutoGen15Private::_freeAttributes__edges);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_FACES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__faces, &ColladaParserAutoGen15Private::_data__faces, &ColladaParserAutoGen15Private::_end__faces, &ColladaParserAutoGen15Private::_preBegin__faces, &ColladaParserAutoGen15Private::_preEnd__faces, &ColladaParserAutoGen15Private::_freeAttributes__faces);
functionMap[HASH_ELEMENT_PCURVES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__pcurves, &ColladaParserAutoGen15Private::_data__pcurves, &ColladaParserAutoGen15Private::_end__pcurves, &ColladaParserAutoGen15Private::_preBegin__pcurves, &ColladaParserAutoGen15Private::_preEnd__pcurves, &ColladaParserAutoGen15Private::_freeAttributes__pcurves);
functionMap[HASH_ELEMENT_SHELLS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__shells, &ColladaParserAutoGen15Private::_data__shells, &ColladaParserAutoGen15Private::_end__shells, &ColladaParserAutoGen15Private::_preBegin__shells, &ColladaParserAutoGen15Private::_preEnd__shells, &ColladaParserAutoGen15Private::_freeAttributes__shells);
functionMap[HASH_ELEMENT_SOLIDS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__solids, &ColladaParserAutoGen15Private::_data__solids, &ColladaParserAutoGen15Private::_end__solids, &ColladaParserAutoGen15Private::_preBegin__solids, &ColladaParserAutoGen15Private::_preEnd__solids, &ColladaParserAutoGen15Private::_freeAttributes__solids);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_SURFACE_CURVES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__surface_curves, &ColladaParserAutoGen15Private::_data__surface_curves, &ColladaParserAutoGen15Private::_end__surface_curves, &ColladaParserAutoGen15Private::_preBegin__surface_curves, &ColladaParserAutoGen15Private::_preEnd__surface_curves, &ColladaParserAutoGen15Private::_freeAttributes__surface_curves);
functionMap[HASH_ELEMENT_SURFACES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__surfaces, &ColladaParserAutoGen15Private::_data__surfaces, &ColladaParserAutoGen15Private::_end__surfaces, &ColladaParserAutoGen15Private::_preBegin__surfaces, &ColladaParserAutoGen15Private::_preEnd__surfaces, &ColladaParserAutoGen15Private::_freeAttributes__surfaces);
functionMap[HASH_ELEMENT_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vertices, &ColladaParserAutoGen15Private::_data__vertices, &ColladaParserAutoGen15Private::_end__vertices, &ColladaParserAutoGen15Private::_preBegin__vertices, &ColladaParserAutoGen15Private::_preEnd__vertices, &ColladaParserAutoGen15Private::_freeAttributes__vertices);
functionMap[HASH_ELEMENT_WIRES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__wires, &ColladaParserAutoGen15Private::_data__wires, &ColladaParserAutoGen15Private::_end__wires, &ColladaParserAutoGen15Private::_preBegin__wires, &ColladaParserAutoGen15Private::_preEnd__wires, &ColladaParserAutoGen15Private::_freeAttributes__wires);
functionMap[HASH_ELEMENT_CURVE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__curve, &ColladaParserAutoGen15Private::_data__curve, &ColladaParserAutoGen15Private::_end__curve, &ColladaParserAutoGen15Private::_preBegin__curve, &ColladaParserAutoGen15Private::_preEnd__curve, &ColladaParserAutoGen15Private::_freeAttributes__curve);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_CIRCLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__circle, &ColladaParserAutoGen15Private::_data__circle, &ColladaParserAutoGen15Private::_end__circle, &ColladaParserAutoGen15Private::_preBegin__circle, &ColladaParserAutoGen15Private::_preEnd__circle, &ColladaParserAutoGen15Private::_freeAttributes__circle);
functionMap[HASH_ELEMENT_ELLIPSE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__ellipse, &ColladaParserAutoGen15Private::_data__ellipse, &ColladaParserAutoGen15Private::_end__ellipse, &ColladaParserAutoGen15Private::_preBegin__ellipse, &ColladaParserAutoGen15Private::_preEnd__ellipse, &ColladaParserAutoGen15Private::_freeAttributes__ellipse);
functionMap[HASH_ELEMENT_HYPERBOLA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__hyperbola, &ColladaParserAutoGen15Private::_data__hyperbola, &ColladaParserAutoGen15Private::_end__hyperbola, &ColladaParserAutoGen15Private::_preBegin__hyperbola, &ColladaParserAutoGen15Private::_preEnd__hyperbola, &ColladaParserAutoGen15Private::_freeAttributes__hyperbola);
functionMap[HASH_ELEMENT_LINE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__line, &ColladaParserAutoGen15Private::_data__line, &ColladaParserAutoGen15Private::_end__line, &ColladaParserAutoGen15Private::_preBegin__line, &ColladaParserAutoGen15Private::_preEnd__line, &ColladaParserAutoGen15Private::_freeAttributes__line);
functionMap[HASH_ELEMENT_NURBS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__nurbs, &ColladaParserAutoGen15Private::_data__nurbs, &ColladaParserAutoGen15Private::_end__nurbs, &ColladaParserAutoGen15Private::_preBegin__nurbs, &ColladaParserAutoGen15Private::_preEnd__nurbs, &ColladaParserAutoGen15Private::_freeAttributes__nurbs);
functionMap[HASH_ELEMENT_ORIENT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__orient, &ColladaParserAutoGen15Private::_data__orient, &ColladaParserAutoGen15Private::_end__orient, &ColladaParserAutoGen15Private::_preBegin__orient, &ColladaParserAutoGen15Private::_preEnd__orient, &ColladaParserAutoGen15Private::_freeAttributes__orient);
functionMap[HASH_ELEMENT_ORIGIN____ORIGIN_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__origin____origin_type, &ColladaParserAutoGen15Private::_data__origin____origin_type, &ColladaParserAutoGen15Private::_end__origin____origin_type, &ColladaParserAutoGen15Private::_preBegin__origin____origin_type, &ColladaParserAutoGen15Private::_preEnd__origin____origin_type, &ColladaParserAutoGen15Private::_freeAttributes__origin____origin_type);
functionMap[HASH_ELEMENT_PARABOLA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__parabola, &ColladaParserAutoGen15Private::_data__parabola, &ColladaParserAutoGen15Private::_end__parabola, &ColladaParserAutoGen15Private::_preBegin__parabola, &ColladaParserAutoGen15Private::_preEnd__parabola, &ColladaParserAutoGen15Private::_freeAttributes__parabola);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float_type, &ColladaParserAutoGen15Private::_data__radius____float_type, &ColladaParserAutoGen15Private::_end__radius____float_type, &ColladaParserAutoGen15Private::_preBegin__radius____float_type, &ColladaParserAutoGen15Private::_preEnd__radius____float_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float2_type, &ColladaParserAutoGen15Private::_data__radius____float2_type, &ColladaParserAutoGen15Private::_end__radius____float2_type, &ColladaParserAutoGen15Private::_preBegin__radius____float2_type, &ColladaParserAutoGen15Private::_preEnd__radius____float2_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float2_type, &ColladaParserAutoGen15Private::_data__radius____float2_type, &ColladaParserAutoGen15Private::_end__radius____float2_type, &ColladaParserAutoGen15Private::_preBegin__radius____float2_type, &ColladaParserAutoGen15Private::_preEnd__radius____float2_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type);
functionMap[HASH_ELEMENT_DIRECTION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__direction, &ColladaParserAutoGen15Private::_data__direction, &ColladaParserAutoGen15Private::_end__direction, &ColladaParserAutoGen15Private::_preBegin__direction, &ColladaParserAutoGen15Private::_preEnd__direction, &ColladaParserAutoGen15Private::_freeAttributes__direction);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_ORIGIN____FLOAT3_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__origin____float3_type, &ColladaParserAutoGen15Private::_data__origin____float3_type, &ColladaParserAutoGen15Private::_end__origin____float3_type, &ColladaParserAutoGen15Private::_preBegin__origin____float3_type, &ColladaParserAutoGen15Private::_preEnd__origin____float3_type, &ColladaParserAutoGen15Private::_freeAttributes__origin____float3_type);
functionMap[HASH_ELEMENT_NURBS_TYPE____CONTROL_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__nurbs_type____control_vertices, &ColladaParserAutoGen15Private::_data__nurbs_type____control_vertices, &ColladaParserAutoGen15Private::_end__nurbs_type____control_vertices, &ColladaParserAutoGen15Private::_preBegin__nurbs_type____control_vertices, &ColladaParserAutoGen15Private::_preEnd__nurbs_type____control_vertices, &ColladaParserAutoGen15Private::_freeAttributes__nurbs_type____control_vertices);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_type, &ColladaParserAutoGen15Private::_data__input____input_local_type, &ColladaParserAutoGen15Private::_end__input____input_local_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type);
functionMap[HASH_ELEMENT_IDREF_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__IDREF_array, &ColladaParserAutoGen15Private::_data__IDREF_array, &ColladaParserAutoGen15Private::_end__IDREF_array, &ColladaParserAutoGen15Private::_preBegin__IDREF_array, &ColladaParserAutoGen15Private::_preEnd__IDREF_array, &ColladaParserAutoGen15Private::_freeAttributes__IDREF_array);
functionMap[HASH_ELEMENT_NAME_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__Name_array, &ColladaParserAutoGen15Private::_data__Name_array, &ColladaParserAutoGen15Private::_end__Name_array, &ColladaParserAutoGen15Private::_preBegin__Name_array, &ColladaParserAutoGen15Private::_preEnd__Name_array, &ColladaParserAutoGen15Private::_freeAttributes__Name_array);
functionMap[HASH_ELEMENT_SIDREF_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__SIDREF_array, &ColladaParserAutoGen15Private::_data__SIDREF_array, &ColladaParserAutoGen15Private::_end__SIDREF_array, &ColladaParserAutoGen15Private::_preBegin__SIDREF_array, &ColladaParserAutoGen15Private::_preEnd__SIDREF_array, &ColladaParserAutoGen15Private::_freeAttributes__SIDREF_array);
functionMap[HASH_ELEMENT_ASSET] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__asset, &ColladaParserAutoGen15Private::_data__asset, &ColladaParserAutoGen15Private::_end__asset, &ColladaParserAutoGen15Private::_preBegin__asset, &ColladaParserAutoGen15Private::_preEnd__asset, &ColladaParserAutoGen15Private::_freeAttributes__asset);
functionMap[HASH_ELEMENT_BOOL_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__bool_array, &ColladaParserAutoGen15Private::_data__bool_array, &ColladaParserAutoGen15Private::_end__bool_array, &ColladaParserAutoGen15Private::_preBegin__bool_array, &ColladaParserAutoGen15Private::_preEnd__bool_array, &ColladaParserAutoGen15Private::_freeAttributes__bool_array);
functionMap[HASH_ELEMENT_FLOAT_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__float_array, &ColladaParserAutoGen15Private::_data__float_array, &ColladaParserAutoGen15Private::_end__float_array, &ColladaParserAutoGen15Private::_preBegin__float_array, &ColladaParserAutoGen15Private::_preEnd__float_array, &ColladaParserAutoGen15Private::_freeAttributes__float_array);
functionMap[HASH_ELEMENT_INT_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__int_array, &ColladaParserAutoGen15Private::_data__int_array, &ColladaParserAutoGen15Private::_end__int_array, &ColladaParserAutoGen15Private::_preBegin__int_array, &ColladaParserAutoGen15Private::_preEnd__int_array, &ColladaParserAutoGen15Private::_freeAttributes__int_array);
functionMap[HASH_ELEMENT_TECHNIQUE____TECHNIQUE_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__technique____technique_type, &ColladaParserAutoGen15Private::_data__technique____technique_type, &ColladaParserAutoGen15Private::_end__technique____technique_type, &ColladaParserAutoGen15Private::_preBegin__technique____technique_type, &ColladaParserAutoGen15Private::_preEnd__technique____technique_type, &ColladaParserAutoGen15Private::_freeAttributes__technique____technique_type);
functionMap[HASH_ELEMENT_SOURCE_TYPE____TECHNIQUE_COMMON] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source_type____technique_common, &ColladaParserAutoGen15Private::_data__source_type____technique_common, &ColladaParserAutoGen15Private::_end__source_type____technique_common, &ColladaParserAutoGen15Private::_preBegin__source_type____technique_common, &ColladaParserAutoGen15Private::_preEnd__source_type____technique_common, &ColladaParserAutoGen15Private::_freeAttributes__source_type____technique_common);
functionMap[HASH_ELEMENT_TOKEN_ARRAY] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__token_array, &ColladaParserAutoGen15Private::_data__token_array, &ColladaParserAutoGen15Private::_end__token_array, &ColladaParserAutoGen15Private::_preBegin__token_array, &ColladaParserAutoGen15Private::_preEnd__token_array, &ColladaParserAutoGen15Private::_freeAttributes__token_array);
functionMap[HASH_ELEMENT_ACCESSOR] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__accessor, &ColladaParserAutoGen15Private::_data__accessor, &ColladaParserAutoGen15Private::_end__accessor, &ColladaParserAutoGen15Private::_preBegin__accessor, &ColladaParserAutoGen15Private::_preEnd__accessor, &ColladaParserAutoGen15Private::_freeAttributes__accessor);
functionMap[HASH_ELEMENT_PARAM____PARAM_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__param____param_type, &ColladaParserAutoGen15Private::_data__param____param_type, &ColladaParserAutoGen15Private::_end__param____param_type, &ColladaParserAutoGen15Private::_preBegin__param____param_type, &ColladaParserAutoGen15Private::_preEnd__param____param_type, &ColladaParserAutoGen15Private::_freeAttributes__param____param_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_FOCAL] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__focal, &ColladaParserAutoGen15Private::_data__focal, &ColladaParserAutoGen15Private::_end__focal, &ColladaParserAutoGen15Private::_preBegin__focal, &ColladaParserAutoGen15Private::_preEnd__focal, &ColladaParserAutoGen15Private::_freeAttributes__focal);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_CURVE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__curve, &ColladaParserAutoGen15Private::_data__curve, &ColladaParserAutoGen15Private::_end__curve, &ColladaParserAutoGen15Private::_preBegin__curve, &ColladaParserAutoGen15Private::_preEnd__curve, &ColladaParserAutoGen15Private::_freeAttributes__curve);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SURFACE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__surface, &ColladaParserAutoGen15Private::_data__surface, &ColladaParserAutoGen15Private::_end__surface, &ColladaParserAutoGen15Private::_preBegin__surface, &ColladaParserAutoGen15Private::_preEnd__surface, &ColladaParserAutoGen15Private::_freeAttributes__surface);
functionMap[HASH_ELEMENT_CONE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__cone, &ColladaParserAutoGen15Private::_data__cone, &ColladaParserAutoGen15Private::_end__cone, &ColladaParserAutoGen15Private::_preBegin__cone, &ColladaParserAutoGen15Private::_preEnd__cone, &ColladaParserAutoGen15Private::_freeAttributes__cone);
functionMap[HASH_ELEMENT_SURFACE_TYPE____CYLINDER] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__surface_type____cylinder, &ColladaParserAutoGen15Private::_data__surface_type____cylinder, &ColladaParserAutoGen15Private::_end__surface_type____cylinder, &ColladaParserAutoGen15Private::_preBegin__surface_type____cylinder, &ColladaParserAutoGen15Private::_preEnd__surface_type____cylinder, &ColladaParserAutoGen15Private::_freeAttributes__surface_type____cylinder);
functionMap[HASH_ELEMENT_NURBS_SURFACE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__nurbs_surface, &ColladaParserAutoGen15Private::_data__nurbs_surface, &ColladaParserAutoGen15Private::_end__nurbs_surface, &ColladaParserAutoGen15Private::_preBegin__nurbs_surface, &ColladaParserAutoGen15Private::_preEnd__nurbs_surface, &ColladaParserAutoGen15Private::_freeAttributes__nurbs_surface);
functionMap[HASH_ELEMENT_ORIENT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__orient, &ColladaParserAutoGen15Private::_data__orient, &ColladaParserAutoGen15Private::_end__orient, &ColladaParserAutoGen15Private::_preBegin__orient, &ColladaParserAutoGen15Private::_preEnd__orient, &ColladaParserAutoGen15Private::_freeAttributes__orient);
functionMap[HASH_ELEMENT_ORIGIN____ORIGIN_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__origin____origin_type, &ColladaParserAutoGen15Private::_data__origin____origin_type, &ColladaParserAutoGen15Private::_end__origin____origin_type, &ColladaParserAutoGen15Private::_preBegin__origin____origin_type, &ColladaParserAutoGen15Private::_preEnd__origin____origin_type, &ColladaParserAutoGen15Private::_freeAttributes__origin____origin_type);
functionMap[HASH_ELEMENT_PLANE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__plane, &ColladaParserAutoGen15Private::_data__plane, &ColladaParserAutoGen15Private::_end__plane, &ColladaParserAutoGen15Private::_preBegin__plane, &ColladaParserAutoGen15Private::_preEnd__plane, &ColladaParserAutoGen15Private::_freeAttributes__plane);
functionMap[HASH_ELEMENT_SPHERE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__sphere, &ColladaParserAutoGen15Private::_data__sphere, &ColladaParserAutoGen15Private::_end__sphere, &ColladaParserAutoGen15Private::_preBegin__sphere, &ColladaParserAutoGen15Private::_preEnd__sphere, &ColladaParserAutoGen15Private::_freeAttributes__sphere);
functionMap[HASH_ELEMENT_SWEPT_SURFACE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__swept_surface, &ColladaParserAutoGen15Private::_data__swept_surface, &ColladaParserAutoGen15Private::_end__swept_surface, &ColladaParserAutoGen15Private::_preBegin__swept_surface, &ColladaParserAutoGen15Private::_preEnd__swept_surface, &ColladaParserAutoGen15Private::_freeAttributes__swept_surface);
functionMap[HASH_ELEMENT_TORUS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__torus, &ColladaParserAutoGen15Private::_data__torus, &ColladaParserAutoGen15Private::_end__torus, &ColladaParserAutoGen15Private::_preBegin__torus, &ColladaParserAutoGen15Private::_preEnd__torus, &ColladaParserAutoGen15Private::_freeAttributes__torus);
functionMap[HASH_ELEMENT_ANGLE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__angle, &ColladaParserAutoGen15Private::_data__angle, &ColladaParserAutoGen15Private::_end__angle, &ColladaParserAutoGen15Private::_preBegin__angle, &ColladaParserAutoGen15Private::_preEnd__angle, &ColladaParserAutoGen15Private::_freeAttributes__angle);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float_type, &ColladaParserAutoGen15Private::_data__radius____float_type, &ColladaParserAutoGen15Private::_end__radius____float_type, &ColladaParserAutoGen15Private::_preBegin__radius____float_type, &ColladaParserAutoGen15Private::_preEnd__radius____float_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float_type, &ColladaParserAutoGen15Private::_data__radius____float_type, &ColladaParserAutoGen15Private::_end__radius____float_type, &ColladaParserAutoGen15Private::_preBegin__radius____float_type, &ColladaParserAutoGen15Private::_preEnd__radius____float_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float_type);
functionMap[HASH_ELEMENT_NURBS_SURFACE_TYPE____CONTROL_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__nurbs_surface_type____control_vertices, &ColladaParserAutoGen15Private::_data__nurbs_surface_type____control_vertices, &ColladaParserAutoGen15Private::_end__nurbs_surface_type____control_vertices, &ColladaParserAutoGen15Private::_preBegin__nurbs_surface_type____control_vertices, &ColladaParserAutoGen15Private::_preEnd__nurbs_surface_type____control_vertices, &ColladaParserAutoGen15Private::_freeAttributes__nurbs_surface_type____control_vertices);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_type, &ColladaParserAutoGen15Private::_data__input____input_local_type, &ColladaParserAutoGen15Private::_end__input____input_local_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type);
functionMap[HASH_ELEMENT_EQUATION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__equation, &ColladaParserAutoGen15Private::_data__equation, &ColladaParserAutoGen15Private::_end__equation, &ColladaParserAutoGen15Private::_preBegin__equation, &ColladaParserAutoGen15Private::_preEnd__equation, &ColladaParserAutoGen15Private::_freeAttributes__equation);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float_type, &ColladaParserAutoGen15Private::_data__radius____float_type, &ColladaParserAutoGen15Private::_end__radius____float_type, &ColladaParserAutoGen15Private::_preBegin__radius____float_type, &ColladaParserAutoGen15Private::_preEnd__radius____float_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float_type);
functionMap[HASH_ELEMENT_AXIS____FLOAT3_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__axis____float3_type, &ColladaParserAutoGen15Private::_data__axis____float3_type, &ColladaParserAutoGen15Private::_end__axis____float3_type, &ColladaParserAutoGen15Private::_preBegin__axis____float3_type, &ColladaParserAutoGen15Private::_preEnd__axis____float3_type, &ColladaParserAutoGen15Private::_freeAttributes__axis____float3_type);
functionMap[HASH_ELEMENT_CURVE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__curve, &ColladaParserAutoGen15Private::_data__curve, &ColladaParserAutoGen15Private::_end__curve, &ColladaParserAutoGen15Private::_preBegin__curve, &ColladaParserAutoGen15Private::_preEnd__curve, &ColladaParserAutoGen15Private::_freeAttributes__curve);
functionMap[HASH_ELEMENT_DIRECTION] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__direction, &ColladaParserAutoGen15Private::_data__direction, &ColladaParserAutoGen15Private::_end__direction, &ColladaParserAutoGen15Private::_preBegin__direction, &ColladaParserAutoGen15Private::_preEnd__direction, &ColladaParserAutoGen15Private::_freeAttributes__direction);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_ORIGIN____FLOAT3_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__origin____float3_type, &ColladaParserAutoGen15Private::_data__origin____float3_type, &ColladaParserAutoGen15Private::_end__origin____float3_type, &ColladaParserAutoGen15Private::_preBegin__origin____float3_type, &ColladaParserAutoGen15Private::_preEnd__origin____float3_type, &ColladaParserAutoGen15Private::_freeAttributes__origin____float3_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_RADIUS____FLOAT2_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__radius____float2_type, &ColladaParserAutoGen15Private::_data__radius____float2_type, &ColladaParserAutoGen15Private::_end__radius____float2_type, &ColladaParserAutoGen15Private::_preBegin__radius____float2_type, &ColladaParserAutoGen15Private::_preEnd__radius____float2_type, &ColladaParserAutoGen15Private::_freeAttributes__radius____float2_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_type, &ColladaParserAutoGen15Private::_data__input____input_local_type, &ColladaParserAutoGen15Private::_end__input____input_local_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_LINES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__lines, &ColladaParserAutoGen15Private::_data__lines, &ColladaParserAutoGen15Private::_end__lines, &ColladaParserAutoGen15Private::_preBegin__lines, &ColladaParserAutoGen15Private::_preEnd__lines, &ColladaParserAutoGen15Private::_freeAttributes__lines);
functionMap[HASH_ELEMENT_LINESTRIPS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__linestrips, &ColladaParserAutoGen15Private::_data__linestrips, &ColladaParserAutoGen15Private::_end__linestrips, &ColladaParserAutoGen15Private::_preBegin__linestrips, &ColladaParserAutoGen15Private::_preEnd__linestrips, &ColladaParserAutoGen15Private::_freeAttributes__linestrips);
functionMap[HASH_ELEMENT_POLYGONS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__polygons, &ColladaParserAutoGen15Private::_data__polygons, &ColladaParserAutoGen15Private::_end__polygons, &ColladaParserAutoGen15Private::_preBegin__polygons, &ColladaParserAutoGen15Private::_preEnd__polygons, &ColladaParserAutoGen15Private::_freeAttributes__polygons);
functionMap[HASH_ELEMENT_POLYLIST] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__polylist, &ColladaParserAutoGen15Private::_data__polylist, &ColladaParserAutoGen15Private::_end__polylist, &ColladaParserAutoGen15Private::_preBegin__polylist, &ColladaParserAutoGen15Private::_preEnd__polylist, &ColladaParserAutoGen15Private::_freeAttributes__polylist);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_TRIANGLES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__triangles, &ColladaParserAutoGen15Private::_data__triangles, &ColladaParserAutoGen15Private::_end__triangles, &ColladaParserAutoGen15Private::_preBegin__triangles, &ColladaParserAutoGen15Private::_preEnd__triangles, &ColladaParserAutoGen15Private::_freeAttributes__triangles);
functionMap[HASH_ELEMENT_TRIFANS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__trifans, &ColladaParserAutoGen15Private::_data__trifans, &ColladaParserAutoGen15Private::_end__trifans, &ColladaParserAutoGen15Private::_preBegin__trifans, &ColladaParserAutoGen15Private::_preEnd__trifans, &ColladaParserAutoGen15Private::_freeAttributes__trifans);
functionMap[HASH_ELEMENT_TRISTRIPS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__tristrips, &ColladaParserAutoGen15Private::_data__tristrips, &ColladaParserAutoGen15Private::_end__tristrips, &ColladaParserAutoGen15Private::_preBegin__tristrips, &ColladaParserAutoGen15Private::_preEnd__tristrips, &ColladaParserAutoGen15Private::_freeAttributes__tristrips);
functionMap[HASH_ELEMENT_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vertices, &ColladaParserAutoGen15Private::_data__vertices, &ColladaParserAutoGen15Private::_end__vertices, &ColladaParserAutoGen15Private::_preBegin__vertices, &ColladaParserAutoGen15Private::_preEnd__vertices, &ColladaParserAutoGen15Private::_freeAttributes__vertices);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_PH] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__ph, &ColladaParserAutoGen15Private::_data__ph, &ColladaParserAutoGen15Private::_end__ph, &ColladaParserAutoGen15Private::_preBegin__ph, &ColladaParserAutoGen15Private::_preEnd__ph, &ColladaParserAutoGen15Private::_freeAttributes__ph);
functionMap[HASH_ELEMENT_H] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__h, &ColladaParserAutoGen15Private::_data__h, &ColladaParserAutoGen15Private::_end__h, &ColladaParserAutoGen15Private::_preBegin__h, &ColladaParserAutoGen15Private::_preEnd__h, &ColladaParserAutoGen15Private::_freeAttributes__h);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_VCOUNT] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vcount, &ColladaParserAutoGen15Private::_data__vcount, &ColladaParserAutoGen15Private::_end__vcount, &ColladaParserAutoGen15Private::_preBegin__vcount, &ColladaParserAutoGen15Private::_preEnd__vcount, &ColladaParserAutoGen15Private::_freeAttributes__vcount);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_OFFSET_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_data__input____input_local_offset_type, &ColladaParserAutoGen15Private::_end__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_offset_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_offset_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_offset_type);
functionMap[HASH_ELEMENT_P] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__p, &ColladaParserAutoGen15Private::_data__p, &ColladaParserAutoGen15Private::_end__p, &ColladaParserAutoGen15Private::_preBegin__p, &ColladaParserAutoGen15Private::_preEnd__p, &ColladaParserAutoGen15Private::_freeAttributes__p);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_LINES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__lines, &ColladaParserAutoGen15Private::_data__lines, &ColladaParserAutoGen15Private::_end__lines, &ColladaParserAutoGen15Private::_preBegin__lines, &ColladaParserAutoGen15Private::_preEnd__lines, &ColladaParserAutoGen15Private::_freeAttributes__lines);
functionMap[HASH_ELEMENT_LINESTRIPS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__linestrips, &ColladaParserAutoGen15Private::_data__linestrips, &ColladaParserAutoGen15Private::_end__linestrips, &ColladaParserAutoGen15Private::_preBegin__linestrips, &ColladaParserAutoGen15Private::_preEnd__linestrips, &ColladaParserAutoGen15Private::_freeAttributes__linestrips);
functionMap[HASH_ELEMENT_POLYGONS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__polygons, &ColladaParserAutoGen15Private::_data__polygons, &ColladaParserAutoGen15Private::_end__polygons, &ColladaParserAutoGen15Private::_preBegin__polygons, &ColladaParserAutoGen15Private::_preEnd__polygons, &ColladaParserAutoGen15Private::_freeAttributes__polygons);
functionMap[HASH_ELEMENT_POLYLIST] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__polylist, &ColladaParserAutoGen15Private::_data__polylist, &ColladaParserAutoGen15Private::_end__polylist, &ColladaParserAutoGen15Private::_preBegin__polylist, &ColladaParserAutoGen15Private::_preEnd__polylist, &ColladaParserAutoGen15Private::_freeAttributes__polylist);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_TRIANGLES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__triangles, &ColladaParserAutoGen15Private::_data__triangles, &ColladaParserAutoGen15Private::_end__triangles, &ColladaParserAutoGen15Private::_preBegin__triangles, &ColladaParserAutoGen15Private::_preEnd__triangles, &ColladaParserAutoGen15Private::_freeAttributes__triangles);
functionMap[HASH_ELEMENT_TRIFANS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__trifans, &ColladaParserAutoGen15Private::_data__trifans, &ColladaParserAutoGen15Private::_end__trifans, &ColladaParserAutoGen15Private::_preBegin__trifans, &ColladaParserAutoGen15Private::_preEnd__trifans, &ColladaParserAutoGen15Private::_freeAttributes__trifans);
functionMap[HASH_ELEMENT_TRISTRIPS] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__tristrips, &ColladaParserAutoGen15Private::_data__tristrips, &ColladaParserAutoGen15Private::_end__tristrips, &ColladaParserAutoGen15Private::_preBegin__tristrips, &ColladaParserAutoGen15Private::_preEnd__tristrips, &ColladaParserAutoGen15Private::_freeAttributes__tristrips);
functionMap[HASH_ELEMENT_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__vertices, &ColladaParserAutoGen15Private::_data__vertices, &ColladaParserAutoGen15Private::_end__vertices, &ColladaParserAutoGen15Private::_preBegin__vertices, &ColladaParserAutoGen15Private::_preEnd__vertices, &ColladaParserAutoGen15Private::_freeAttributes__vertices);
functionMap[HASH_ELEMENT_SPLINE_TYPE____CONTROL_VERTICES] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__spline_type____control_vertices, &ColladaParserAutoGen15Private::_data__spline_type____control_vertices, &ColladaParserAutoGen15Private::_end__spline_type____control_vertices, &ColladaParserAutoGen15Private::_preBegin__spline_type____control_vertices, &ColladaParserAutoGen15Private::_preEnd__spline_type____control_vertices, &ColladaParserAutoGen15Private::_freeAttributes__spline_type____control_vertices);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_SOURCE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__source, &ColladaParserAutoGen15Private::_data__source, &ColladaParserAutoGen15Private::_end__source, &ColladaParserAutoGen15Private::_preBegin__source, &ColladaParserAutoGen15Private::_preEnd__source, &ColladaParserAutoGen15Private::_freeAttributes__source);
functionMap[HASH_ELEMENT_EXTRA] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__extra, &ColladaParserAutoGen15Private::_data__extra, &ColladaParserAutoGen15Private::_end__extra, &ColladaParserAutoGen15Private::_preBegin__extra, &ColladaParserAutoGen15Private::_preEnd__extra, &ColladaParserAutoGen15Private::_freeAttributes__extra);
functionMap[HASH_ELEMENT_INPUT____INPUT_LOCAL_TYPE] = ColladaParserAutoGen15Private::FunctionStruct(&ColladaParserAutoGen15Private::_begin__input____input_local_type, &ColladaParserAutoGen15Private::_data__input____input_local_type, &ColladaParserAutoGen15Private::_end__input____input_local_type, &ColladaParserAutoGen15Private::_preBegin__input____input_local_type, &ColladaParserAutoGen15Private::_preEnd__input____input_local_type, &ColladaParserAutoGen15Private::_freeAttributes__input____input_local_type);
mapFilled = true;
}
return functionMap;
}